

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O3

bool __thiscall dg::array_match(dg *this,StringRef name,char **names)

{
  int iVar1;
  char *pcVar2;
  char *__n;
  char *__s;
  ulong uVar3;
  
  __n = name.Data;
  __s = *(char **)name.Length;
  if (__s != (char *)0x0) {
    uVar3 = 1;
    do {
      pcVar2 = (char *)strlen(__s);
      if (pcVar2 == __n) {
        if (__n == (char *)0x0) {
          return true;
        }
        iVar1 = bcmp(this,__s,(size_t)__n);
        if (iVar1 == 0) {
          return true;
        }
      }
      __s = (char *)((long *)name.Length)[uVar3];
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (__s != (char *)0x0);
  }
  return false;
}

Assistant:

static bool array_match(llvm::StringRef name, const char *names[]) {
    unsigned idx = 0;
    while (names[idx]) {
        if (name.equals(names[idx]))
            return true;
        ++idx;
    }

    return false;
}